

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

void __thiscall LLVMBC::UnaryOperator::UnaryOperator(UnaryOperator *this,UnaryOps uop,Value *value)

{
  Type *type;
  Value *local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  type = Value::getType(value);
  Instruction::Instruction(&this->super_Instruction,type,UnaryOperator);
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0;
  local_30 = value;
  std::vector<LLVMBC::Value*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value*>>::
  _M_range_initialize<LLVMBC::Value*const*>
            ((vector<LLVMBC::Value*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value*>> *)&local_28,
             &local_30);
  std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::_M_move_assign
            (&(this->super_Instruction).operands,
             (vector<LLVMBC::Value*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value*>> *)&local_28);
  std::_Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::
  ~_Vector_base((_Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> *)
                &local_28);
  return;
}

Assistant:

UnaryOperator::UnaryOperator(UnaryOps uop, Value *value)
    : Instruction(value->getType(), ValueKind::UnaryOperator)
{
	set_operands({ value });
}